

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-ipv6.c
# Opt level: O2

int run_test_udp_ipv6_only(void)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  
  iVar2 = can_ipv6();
  if (iVar2 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  do_test(ipv6_recv_fail,1);
  if (recv_cb_called == 0) {
    if (send_cb_called == 1) {
      return 0;
    }
    pcVar1 = "cl_send_cb_called == 1";
    uVar3 = 0xf8;
  }
  else {
    pcVar1 = "cl_recv_cb_called == 0";
    uVar3 = 0xf7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-ipv6.c"
          ,uVar3,pcVar1 + 3);
  abort();
}

Assistant:

TEST_IMPL(udp_ipv6_only) {
  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  do_test(ipv6_recv_fail, UV_UDP_IPV6ONLY);

  ASSERT(recv_cb_called == 0);
  ASSERT(send_cb_called == 1);

  return 0;
}